

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O2

ByteBuffer * __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::Encode
          (ByteBuffer *__return_storage_ptr__,SubscriptionSync *this,int version)

{
  OutputStream *stream;
  pointer pSVar1;
  uint32_t value;
  uint8_t data;
  uint uVar2;
  ZLIBBufferCompressor *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arr;
  _Base_ptr p_Var3;
  pointer to_copy;
  _Self __tmp;
  ByteBuffer subject_buffer;
  Subject subject;
  ByteBuffer message_frame;
  
  tools::ByteBuffer::ByteBuffer(&message_frame,0x2000);
  tools::ByteBuffer::WriteByte(&message_frame,'S');
  stream = &message_frame.super_OutputStream;
  value = this->options_ & 1;
  if (1 < version) {
    value = this->options_;
  }
  tools::Varint::WriteU32(stream,value);
  tools::Varint::WriteU32(stream,this->edition_);
  tools::Varint::WriteU32(stream,(uint32_t)this->size_);
  if ((this->options_ & 1) == 0) {
    this_00 = (ZLIBBufferCompressor *)operator_new(0x38);
    (this_00->stream_).next_out = (Bytef *)0x0;
    *(uchar **)&(this_00->stream_).avail_out = (uchar *)0x0;
    ((OutputStream *)&(this_00->stream_).avail_in)->_vptr_OutputStream = (_func_int **)0x0;
    (this_00->stream_).total_in = 0;
    (this_00->super_BufferCompressor)._vptr_BufferCompressor = (_func_int **)0x0;
    ((InputStream *)&(this_00->stream_).next_in)->_vptr_InputStream = (_func_int **)0x0;
    (this_00->stream_).total_out = 0;
    tools::UncompressedBufferCompressor::UncompressedBufferCompressor
              ((UncompressedBufferCompressor *)this_00);
  }
  else {
    this_00 = (ZLIBBufferCompressor *)operator_new(0xa8);
    tools::ZLIBBufferCompressor::ZLIBBufferCompressor(this_00,5);
  }
  tools::ByteBuffer::ByteBuffer(&subject_buffer,0x2000);
  uVar2 = this->options_;
  if ((uVar2 & 4) == 0) {
    pSVar1 = (this->subjects_).
             super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (to_copy = (this->subjects_).
                   super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                   ._M_impl.super__Vector_impl_data._M_start; to_copy != pSVar1;
        to_copy = to_copy + 1) {
      price::subject::Subject::Subject(&subject,to_copy);
      arr = price::subject::Subject::GetComponents_abi_cxx11_(&subject);
      tools::Varint::WriteStringVector(&subject_buffer.super_OutputStream,arr);
      (**(this_00->super_BufferCompressor)._vptr_BufferCompressor)(this_00,&subject_buffer);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&subject.components_);
    }
    uVar2 = this->options_;
  }
  if ((1 < version) && ((uVar2 & 2) != 0)) {
    tools::Varint::WriteU32
              (&subject_buffer.super_OutputStream,
               (uint32_t)(this->controls_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    for (p_Var3 = (this->controls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->controls_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      tools::Varint::WriteU32(&subject_buffer.super_OutputStream,p_Var3[1]._M_color);
      data = ControlOperation::GetCode(*(ControlOperationEnum *)&p_Var3[1].field_0x4);
      tools::ByteBuffer::WriteByte(&subject_buffer,data);
    }
    (**(this_00->super_BufferCompressor)._vptr_BufferCompressor)(this_00,&subject_buffer);
  }
  (*(this_00->super_BufferCompressor)._vptr_BufferCompressor[1])(&subject,this_00);
  tools::ByteBuffer::WriteBytes(&message_frame,(ByteBuffer *)&subject);
  tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&subject);
  operator_delete(this_00,8);
  tools::ByteBuffer::ByteBuffer(__return_storage_ptr__,&message_frame);
  tools::ByteBuffer::~ByteBuffer(&subject_buffer);
  tools::ByteBuffer::~ByteBuffer(&message_frame);
  return __return_storage_ptr__;
}

Assistant:

ByteBuffer SubscriptionSync::Encode(int version) const
{
    ByteBuffer message_frame;
    message_frame.WriteByte(PixieMessageType::SUBSCRIPTION_SYNC);
    Varint::WriteU32(message_frame, (unsigned int) (version < PixieVersion::VERSION2 ? options_ & 1 : options_));
    Varint::WriteU32(message_frame, (unsigned int) edition_);
    Varint::WriteU32(message_frame, (unsigned int) size_);

    BufferCompressor* compressor = IsCompressed() ? (BufferCompressor*) new ZLIBBufferCompressor(5) : (BufferCompressor*) new UncompressedBufferCompressor();
    ByteBuffer subject_buffer;

    if (IsChangedEdition())
    {
        for (Subject subject : subjects_)
        {
            Varint::WriteStringVector(subject_buffer, subject.GetComponents());
            compressor->Compress(subject_buffer);
        }
    }
    if (HasControls() && version >= PixieVersion::VERSION2)
    {
        Varint::WriteU32(subject_buffer, static_cast<unsigned int>(controls_.size()));

        for (auto itt = controls_.begin(); itt != controls_.end(); itt ++)
        {
            Varint::WriteU32(subject_buffer, (unsigned int) itt->first);
            subject_buffer.WriteByte(ControlOperation::GetCode(itt->second));
        }
        compressor->Compress(subject_buffer);
    }

    message_frame.WriteBytes(compressor->GetCompressed());
    delete compressor;
    return std::move(message_frame);
}